

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void http_close(nni_http_conn *conn)

{
  nng_stream *pnVar1;
  nni_aio *pnVar2;
  
  if (conn->closed == false) {
    conn->closed = true;
    nni_aio_close(&conn->wr_aio);
    nni_aio_close(&conn->rd_aio);
    pnVar2 = conn->rd_uaio;
    if (pnVar2 != (nni_aio *)0x0) {
      conn->rd_uaio = (nni_aio *)0x0;
      nni_aio_finish_error(pnVar2,NNG_ECLOSED);
    }
    pnVar2 = conn->wr_uaio;
    if (pnVar2 != (nni_aio *)0x0) {
      conn->wr_uaio = (nni_aio *)0x0;
      nni_aio_finish_error(pnVar2,NNG_ECLOSED);
    }
    pnVar2 = (nni_aio *)nni_list_first(&conn->wrq);
    while (pnVar2 != (nni_aio *)0x0) {
      nni_aio_list_remove(pnVar2);
      nni_aio_finish_error(pnVar2,NNG_ECLOSED);
      pnVar2 = (nni_aio *)nni_list_first(&conn->wrq);
    }
    pnVar2 = (nni_aio *)nni_list_first(&conn->rdq);
    while (pnVar2 != (nni_aio *)0x0) {
      nni_aio_list_remove(pnVar2);
      nni_aio_finish_error(pnVar2,NNG_ECLOSED);
      pnVar2 = (nni_aio *)nni_list_first(&conn->rdq);
    }
    pnVar1 = conn->sock;
    if (pnVar1 != (nng_stream *)0x0) {
      if (pnVar1 != (nng_stream *)0x0) {
        (*pnVar1->s_close)(pnVar1);
        return;
      }
      return;
    }
  }
  return;
}

Assistant:

static void
http_close(nni_http_conn *conn)
{
	// Call with lock held.
	nni_aio *aio;

	if (conn->closed) {
		return;
	}

	conn->closed = true;
	nni_aio_close(&conn->wr_aio);
	nni_aio_close(&conn->rd_aio);

	if ((aio = conn->rd_uaio) != NULL) {
		conn->rd_uaio = NULL;
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	if ((aio = conn->wr_uaio) != NULL) {
		conn->wr_uaio = NULL;
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	// Abort all operations except the one in flight.
	while ((aio = nni_list_first(&conn->wrq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	while ((aio = nni_list_first(&conn->rdq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	if (conn->sock != NULL) {
		nng_stream_close(conn->sock);
	}
}